

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O2

void Packet::printPacket(char *buf,size_t len)

{
  size_t i;
  ulong uVar1;
  
  for (uVar1 = 0; len != uVar1; uVar1 = uVar1 + 1) {
    if ((uVar1 & 7) == 0) {
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
    printf("%02hhx|",(ulong)(uint)(int)buf[uVar1]);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void Packet::printPacket(const char* const buf, const size_t len) {
  for (size_t i = 0; i < len; ++i) {
    if (i % 8 == 0) {
      std::cout << std::endl;
    }
    printf("%02hhx|", buf[i]);
  }
  std::cout << std::endl;
}